

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O1

int Test_SUNSparseMatrixToCSC(SUNMatrix A)

{
  int iVar1;
  SUNMatrix *pp_Var2;
  SUNMatrix csr;
  SUNMatrix csc;
  SUNMatrix local_28;
  undefined8 local_20;
  
  pp_Var2 = (SUNMatrix *)&local_20;
  local_20 = 0;
  local_28 = (SUNMatrix)0x0;
  iVar1 = SUNSparseMatrix_ToCSC(A,pp_Var2);
  if (iVar1 == 0) {
    iVar1 = SUNSparseMatrix_ToCSR(local_20,&local_28);
    if (iVar1 == 0) {
      iVar1 = check_matrix(A,local_28,4.440892098500626e-14);
      if (iVar1 == 0) {
        puts("    PASSED test -- SUNSparseMatrixToCSC");
        SUNMatDestroy(local_28);
        iVar1 = 0;
        goto LAB_00103e7a;
      }
      puts(">>> FAILED test --  Test_SUNSparseMatrixToCSC check_martrix failed");
      SUNMatDestroy(local_28);
    }
    else {
      puts(">>> FAILED test -- SUNSparseMatrix_ToCSR returned nonzero");
    }
    iVar1 = 1;
  }
  else {
    puts(">>> FAILED test -- SUNSparseMatrix_ToCSC returned nonzero");
    iVar1 = 1;
    pp_Var2 = &local_28;
  }
LAB_00103e7a:
  SUNMatDestroy(*pp_Var2);
  return iVar1;
}

Assistant:

int Test_SUNSparseMatrixToCSC(SUNMatrix A)
{
  int failure;
  SUNMatrix csc = NULL, csr = NULL;
  sunrealtype tol = 200 * SUN_UNIT_ROUNDOFF;

  failure = SUNSparseMatrix_ToCSC(A, &csc);

  if (failure)
  {
    printf(">>> FAILED test -- SUNSparseMatrix_ToCSC returned nonzero\n");
    SUNMatDestroy(csr);
    return (1);
  }

  /* check entries */
  if (SUNSparseMatrix_ToCSR(csc, &csr))
  {
    printf(">>> FAILED test -- SUNSparseMatrix_ToCSR returned nonzero\n");
    SUNMatDestroy(csc);
    return (1);
  }

  if (check_matrix(A, csr, tol))
  {
    printf(
      ">>> FAILED test --  Test_SUNSparseMatrixToCSC check_martrix failed\n");
    SUNMatDestroy(csr);
    SUNMatDestroy(csc);
    return (1);
  }

  printf("    PASSED test -- SUNSparseMatrixToCSC\n");

  SUNMatDestroy(csr);
  SUNMatDestroy(csc);

  return (0);
}